

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaCheckSRCRedefineFirst(xmlSchemaParserCtxtPtr pctxt)

{
  xmlSchemaTypeType xVar1;
  xmlSchemaParserCtxtPtr pxVar2;
  xmlChar *str1;
  xmlChar *str2;
  xmlChar *pxVar3;
  xmlNodePtr local_60;
  xmlNodePtr node_1;
  xmlChar *str_1;
  xmlNodePtr node;
  xmlChar *str;
  xmlSchemaBasicItemPtr pxStack_38;
  int wasRedefined;
  xmlSchemaBasicItemPtr item;
  xmlSchemaBasicItemPtr prev;
  xmlSchemaRedefPtr_conflict redef;
  xmlSchemaParserCtxtPtr pxStack_18;
  int err;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  redef._4_4_ = 0;
  prev = (xmlSchemaBasicItemPtr)pctxt->constructor->redefs;
  pxStack_18 = pctxt;
  if ((xmlSchemaRedefPtr_conflict)prev == (xmlSchemaRedefPtr_conflict)0x0) {
    pctxt_local._4_4_ = 0;
  }
  else {
    do {
      pxStack_38 = (xmlSchemaBasicItemPtr)prev->dummy;
      item = xmlSchemaFindRedefCompInGraph
                       (*(xmlSchemaBucketPtr_conflict *)(prev + 3),pxStack_38->type,
                        *(xmlChar **)(prev + 2),(xmlChar *)prev[2].dummy);
      if (item == (xmlSchemaBasicItemPtr)0x0) {
        node = (xmlNodePtr)0x0;
        if (*(long *)(prev + 1) == 0) {
          str_1 = (xmlChar *)xmlSchemaGetComponentNode(pxStack_38);
        }
        else {
          str_1 = (xmlChar *)xmlSchemaGetComponentNode(*(xmlSchemaBasicItemPtr *)(prev + 1));
        }
        pxVar2 = pxStack_18;
        pxVar3 = str_1;
        str1 = xmlSchemaGetComponentTypeStr(pxStack_38);
        str2 = xmlSchemaFormatQName
                         ((xmlChar **)&node,(xmlChar *)prev[2].dummy,*(xmlChar **)(prev + 2));
        xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pxVar2,XML_SCHEMAP_SRC_REDEFINE,
                           (xmlNodePtr)pxVar3,(xmlSchemaBasicItemPtr)0x0,
                           "The %s \'%s\' to be redefined could not be found in the redefined schema"
                           ,str1,str2);
        if (node != (xmlNodePtr)0x0) {
          (*xmlFree)(node);
          node = (xmlNodePtr)0x0;
        }
        redef._4_4_ = pxStack_18->err;
        prev = *(xmlSchemaBasicItemPtr *)prev;
      }
      else {
        str._4_4_ = 0;
        xVar1 = pxStack_38->type;
        if (xVar1 - XML_SCHEMA_TYPE_SIMPLE < 2) {
          if (((ulong)item[5].dummy & 0x40000000) == 0) {
            *(uint *)&item[5].dummy = *(uint *)&item[5].dummy | 0x40000000;
            *(xmlSchemaBasicItemPtr *)(pxStack_38 + 7) = item;
          }
          else {
            str._4_4_ = 1;
          }
        }
        else if (xVar1 == XML_SCHEMA_TYPE_ATTRIBUTEGROUP) {
          if (((ulong)item[4].dummy & 8) == 0) {
            *(uint *)&item[4].dummy = *(uint *)&item[4].dummy | 8;
            if (*(long *)(prev + 1) == 0) {
              prev[1].dummy = item;
            }
            else {
              *(xmlSchemaBasicItemPtr *)(*(long *)(prev + 1) + 8) = item;
              prev[1].dummy = (void *)0x0;
            }
          }
          else {
            str._4_4_ = 1;
          }
        }
        else {
          if (xVar1 != XML_SCHEMA_TYPE_GROUP) {
            xmlSchemaInternalErr
                      ((xmlSchemaAbstractCtxtPtr)pxStack_18,"xmlSchemaResolveRedefReferences",
                       "Unexpected redefined component type");
            return -1;
          }
          if (((ulong)item[3].dummy & 2) == 0) {
            *(uint *)&item[3].dummy = *(uint *)&item[3].dummy | 2;
            if (*(long *)(prev + 1) != 0) {
              *(xmlSchemaBasicItemPtr *)(*(long *)(prev + 1) + 0x18) = item;
            }
            prev[1].dummy = item;
          }
          else {
            str._4_4_ = 1;
          }
        }
        if (str._4_4_ == 0) {
          prev = *(xmlSchemaBasicItemPtr *)prev;
        }
        else {
          node_1 = (xmlNodePtr)0x0;
          if (*(long *)(prev + 1) == 0) {
            local_60 = xmlSchemaGetComponentNode((xmlSchemaBasicItemPtr)prev->dummy);
          }
          else {
            local_60 = xmlSchemaGetComponentNode(*(xmlSchemaBasicItemPtr *)(prev + 1));
          }
          pxVar2 = pxStack_18;
          pxVar3 = xmlSchemaGetComponentDesignation((xmlChar **)&node_1,item);
          xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pxVar2,XML_SCHEMAP_SRC_REDEFINE,local_60,
                             (xmlSchemaBasicItemPtr)0x0,
                             "The referenced %s was already redefined. Multiple redefinition of the same component is not supported"
                             ,pxVar3,(xmlChar *)0x0);
          if (node_1 != (xmlNodePtr)0x0) {
            (*xmlFree)(node_1);
            node_1 = (xmlNodePtr)0x0;
          }
          redef._4_4_ = pxStack_18->err;
          prev = *(xmlSchemaBasicItemPtr *)prev;
        }
      }
    } while (prev != (xmlSchemaBasicItemPtr)0x0);
    pctxt_local._4_4_ = redef._4_4_;
  }
  return pctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaCheckSRCRedefineFirst(xmlSchemaParserCtxtPtr pctxt)
{
    int err = 0;
    xmlSchemaRedefPtr redef = WXS_CONSTRUCTOR(pctxt)->redefs;
    xmlSchemaBasicItemPtr prev, item;
    int wasRedefined;

    if (redef == NULL)
	return(0);

    do {
	item = redef->item;
	/*
	* First try to locate the redefined component in the
	* schema graph starting with the redefined schema.
	* NOTE: According to this schema bug entry:
	*   http://lists.w3.org/Archives/Public/www-xml-schema-comments/2005OctDec/0019.html
	*   it's not clear if the referenced component needs to originate
	*   from the <redefine>d schema _document_ or the schema; the latter
	*   would include all imported and included sub-schemas of the
	*   <redefine>d schema. Currently the latter approach is used.
	*   SUPPLEMENT: It seems that the WG moves towards the latter
	*   approach, so we are doing it right.
	*
	*/
	prev = xmlSchemaFindRedefCompInGraph(
	    redef->targetBucket, item->type,
	    redef->refName, redef->refTargetNs);
	if (prev == NULL) {
	    xmlChar *str = NULL;
	    xmlNodePtr node;

	    /*
	    * SPEC src-redefine:
	    * (6.2.1) "The `actual value` of its own name attribute plus
	    * target namespace must successfully `resolve` to a model
	    * group definition in I."
	    * (7.2.1) "The `actual value` of its own name attribute plus
	    * target namespace must successfully `resolve` to an attribute
	    * group definition in I."

	    *
	    * Note that, if we are redefining with the use of references
	    * to components, the spec assumes the src-resolve to be used;
	    * but this won't assure that we search only *inside* the
	    * redefined schema.
	    */
	    if (redef->reference)
		node = WXS_ITEM_NODE(redef->reference);
	    else
		node = WXS_ITEM_NODE(item);
	    xmlSchemaCustomErr(ACTXT_CAST pctxt,
		/*
		* TODO: error code.
		* Probably XML_SCHEMAP_SRC_RESOLVE, if this is using the
		* reference kind.
		*/
		XML_SCHEMAP_SRC_REDEFINE, node, NULL,
		"The %s '%s' to be redefined could not be found in "
		"the redefined schema",
		WXS_ITEM_TYPE_NAME(item),
		xmlSchemaFormatQName(&str, redef->refTargetNs,
		    redef->refName));
	    FREE_AND_NULL(str);
	    err = pctxt->err;
	    redef = redef->next;
	    continue;
	}
	/*
	* TODO: Obtaining and setting the redefinition state is really
	* clumsy.
	*/
	wasRedefined = 0;
	switch (item->type) {
	    case XML_SCHEMA_TYPE_COMPLEX:
	    case XML_SCHEMA_TYPE_SIMPLE:
		if ((WXS_TYPE_CAST prev)->flags &
		    XML_SCHEMAS_TYPE_REDEFINED)
		{
		    wasRedefined = 1;
		    break;
		}
		/* Mark it as redefined. */
		(WXS_TYPE_CAST prev)->flags |= XML_SCHEMAS_TYPE_REDEFINED;
		/*
		* Assign the redefined type to the
		* base type of the redefining type.
		* TODO: How
		*/
		((xmlSchemaTypePtr) item)->baseType =
		    (xmlSchemaTypePtr) prev;
		break;
	    case XML_SCHEMA_TYPE_GROUP:
		if ((WXS_MODEL_GROUPDEF_CAST prev)->flags &
		    XML_SCHEMA_MODEL_GROUP_DEF_REDEFINED)
		{
		    wasRedefined = 1;
		    break;
		}
		/* Mark it as redefined. */
		(WXS_MODEL_GROUPDEF_CAST prev)->flags |=
		    XML_SCHEMA_MODEL_GROUP_DEF_REDEFINED;
		if (redef->reference != NULL) {
		    /*
		    * Overwrite the QName-reference with the
		    * referenced model group def.
		    */
		    (WXS_PTC_CAST redef->reference)->children =
			WXS_TREE_CAST prev;
		}
		redef->target = prev;
		break;
	    case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
		if ((WXS_ATTR_GROUP_CAST prev)->flags &
		    XML_SCHEMAS_ATTRGROUP_REDEFINED)
		{
		    wasRedefined = 1;
		    break;
		}
		(WXS_ATTR_GROUP_CAST prev)->flags |=
		    XML_SCHEMAS_ATTRGROUP_REDEFINED;
		if (redef->reference != NULL) {
		    /*
		    * Assign the redefined attribute group to the
		    * QName-reference component.
		    * This is the easy case, since we will just
		    * expand the redefined group.
		    */
		    (WXS_QNAME_CAST redef->reference)->item = prev;
		    redef->target = NULL;
		} else {
		    /*
		    * This is the complicated case: we need
		    * to apply src-redefine (7.2.2) at a later
		    * stage, i.e. when attribute group references
		    * have been expanded and simple types have
		    * been fixed.
		    */
		    redef->target = prev;
		}
		break;
	    default:
		PERROR_INT("xmlSchemaResolveRedefReferences",
		    "Unexpected redefined component type");
		return(-1);
	}
	if (wasRedefined) {
	    xmlChar *str = NULL;
	    xmlNodePtr node;

	    if (redef->reference)
		node = WXS_ITEM_NODE(redef->reference);
	    else
		node = WXS_ITEM_NODE(redef->item);

	    xmlSchemaCustomErr(ACTXT_CAST pctxt,
		/* TODO: error code. */
		XML_SCHEMAP_SRC_REDEFINE,
		node, NULL,
		"The referenced %s was already redefined. Multiple "
		"redefinition of the same component is not supported",
		xmlSchemaGetComponentDesignation(&str, prev),
		NULL);
	    FREE_AND_NULL(str)
	    err = pctxt->err;
	    redef = redef->next;
	    continue;
	}
	redef = redef->next;
    } while (redef != NULL);

    return(err);
}